

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

Value * __thiscall toml::internal::Parser::parseGroupKey(Parser *this,Value *root)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  TokenType TVar3;
  iterator iVar4;
  Value *this_00;
  _Base_ptr p_Var5;
  _Rb_tree_color _Var6;
  char cVar7;
  string key;
  Value local_a0;
  TokenType local_8c;
  undefined1 local_88 [8];
  _Rb_tree_node_base _Stack_80;
  size_t local_60;
  key_type local_50;
  
  if ((this->token_).type_ == LBRACKET) {
    nextKey(this);
    local_8c = (this->token_).type_;
    if (local_8c == LBRACKET) {
      nextKey(this);
    }
    do {
      if (1 < (this->token_).type_ - IDENT) {
        return (Value *)0x0;
      }
      pcVar1 = (this->token_).str_value_._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + (this->token_).str_value_._M_string_length);
      nextKey(this);
      TVar3 = (this->token_).type_;
      cVar7 = '\x01';
      if (TVar3 == RBRACKET) {
        nextKey(this);
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                        *)((_Base_ptr)root)->_M_parent,&local_50);
        if (iVar4._M_node == (_Base_ptr)&((_Base_ptr)root)->_M_parent->_M_parent) {
          if (local_8c == LBRACKET) {
            local_88 = (undefined1  [8])0x0;
            _Stack_80._0_8_ = (pointer)0x0;
            _Stack_80._M_parent = (_Base_ptr)0x0;
            local_a0.type_ = ARRAY_TYPE;
            local_a0.field_1.null_ = operator_new(0x18);
            ((local_a0.field_1.array_)->
            super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (local_a0.field_1.string_)->_M_string_length = 0;
            ((local_a0.field_1.array_)->
            super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            _Stack_80._M_parent = (_Base_ptr)0x0;
            local_88 = (undefined1  [8])0x0;
            _Stack_80._0_8_ = (pointer)0x0;
            this_00 = Value::setChild(root,&local_50,&local_a0);
            Value::~Value(&local_a0);
            std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector
                      ((vector<toml::Value,_std::allocator<toml::Value>_> *)local_88);
            _Stack_80._M_parent = (_Base_ptr)0x0;
            local_88 = (undefined1  [8])0x0;
            _Stack_80._0_8_ = (pointer)0x0;
            _Stack_80._M_left = &_Stack_80;
            local_60 = 0;
            local_a0.type_ = TABLE_TYPE;
            _Stack_80._M_right = _Stack_80._M_left;
            local_a0.field_1.null_ = operator_new(0x30);
            ((local_a0.field_1.array_)->
            super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            *(size_type **)((long)&(local_a0.field_1.string_)->field_2 + 8) =
                 &(local_a0.field_1.string_)->_M_string_length;
            ((local_a0.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)&(local_a0.field_1.string_)->_M_string_length;
            ((local_a0.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
            *(undefined4 *)&(local_a0.field_1.string_)->_M_string_length = 0;
            root = Value::push(this_00,&local_a0);
          }
          else {
            _Stack_80._M_parent = (_Base_ptr)0x0;
            local_88 = (undefined1  [8])0x0;
            _Stack_80._0_8_ = (pointer)0x0;
            _Stack_80._M_left = &_Stack_80;
            local_60 = 0;
            local_a0.type_ = TABLE_TYPE;
            _Stack_80._M_right = _Stack_80._M_left;
            local_a0.field_1.null_ = operator_new(0x30);
            ((local_a0.field_1.array_)->
            super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            *(size_type **)((long)&(local_a0.field_1.string_)->field_2 + 8) =
                 &(local_a0.field_1.string_)->_M_string_length;
            ((local_a0.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)&(local_a0.field_1.string_)->_M_string_length;
            ((local_a0.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
            *(undefined4 *)&(local_a0.field_1.string_)->_M_string_length = 0;
            root = Value::setChild(root,&local_50,&local_a0);
          }
LAB_0015a22e:
          Value::~Value(&local_a0);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                       *)local_88);
          cVar7 = '\x03';
        }
        else {
          p_Var5 = iVar4._M_node + 2;
          _Var6 = p_Var5->_M_color;
          if (local_8c == LBRACKET) {
            if (_Var6 == 6) {
              _Stack_80._M_parent = (_Base_ptr)0x0;
              local_88 = (undefined1  [8])0x0;
              _Stack_80._0_8_ = (pointer)0x0;
              _Stack_80._M_left = &_Stack_80;
              local_60 = 0;
              local_a0.type_ = TABLE_TYPE;
              _Stack_80._M_right = _Stack_80._M_left;
              local_a0.field_1.null_ = operator_new(0x30);
              ((local_a0.field_1.array_)->
              super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(size_type **)((long)&(local_a0.field_1.string_)->field_2 + 8) =
                   &(local_a0.field_1.string_)->_M_string_length;
              ((local_a0.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)&(local_a0.field_1.string_)->_M_string_length;
              ((local_a0.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
              *(undefined4 *)&(local_a0.field_1.string_)->_M_string_length = 0;
              root = Value::push((Value *)p_Var5,&local_a0);
              goto LAB_0015a22e;
            }
          }
          else {
            if (_Var6 == 6) {
              p_Var2 = (iVar4._M_node[2]._M_parent)->_M_parent;
              if (p_Var2 == *(_Base_ptr *)iVar4._M_node[2]._M_parent) {
                _Var6 = 6;
              }
              else {
                _Var6 = *(_Rb_tree_color *)&p_Var2[-1]._M_left;
                p_Var5 = (_Base_ptr)&p_Var2[-1]._M_left;
              }
            }
            if (_Var6 == 7) {
              root = (Value *)p_Var5;
            }
            cVar7 = (_Var6 == 7) * '\x02' + '\x01';
          }
        }
      }
      else if (TVar3 == DOT) {
        nextKey(this);
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                        *)((_Base_ptr)root)->_M_parent,&local_50);
        if (iVar4._M_node == (_Base_ptr)&((_Base_ptr)root)->_M_parent->_M_parent) {
          _Stack_80._M_parent = (_Base_ptr)0x0;
          local_88 = (undefined1  [8])0x0;
          _Stack_80._0_8_ = (pointer)0x0;
          _Stack_80._M_left = &_Stack_80;
          local_60 = 0;
          local_a0.type_ = TABLE_TYPE;
          _Stack_80._M_right = _Stack_80._M_left;
          local_a0.field_1.null_ = operator_new(0x30);
          ((local_a0.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(size_type **)((long)&(local_a0.field_1.string_)->field_2 + 8) =
               &(local_a0.field_1.string_)->_M_string_length;
          ((local_a0.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)&(local_a0.field_1.string_)->_M_string_length;
          ((local_a0.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
          *(undefined4 *)&(local_a0.field_1.string_)->_M_string_length = 0;
          root = Value::setChild(root,&local_50,&local_a0);
          Value::~Value(&local_a0);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                       *)local_88);
          cVar7 = '\x02';
        }
        else {
          p_Var5 = iVar4._M_node + 2;
          _Var6 = p_Var5->_M_color;
          if (_Var6 == 6) {
            p_Var2 = (iVar4._M_node[2]._M_parent)->_M_parent;
            if (p_Var2 == *(_Base_ptr *)iVar4._M_node[2]._M_parent) {
              _Var6 = 6;
            }
            else {
              _Var6 = *(_Rb_tree_color *)&p_Var2[-1]._M_left;
              p_Var5 = (_Base_ptr)&p_Var2[-1]._M_left;
            }
          }
          if (_Var6 == 7) {
            root = (Value *)p_Var5;
          }
          cVar7 = (_Var6 == 7) + '\x01';
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (cVar7 == '\x02');
    if (cVar7 == '\x03') {
      TVar3 = (this->token_).type_;
      if (local_8c == LBRACKET) {
        if (TVar3 != RBRACKET) {
          return (Value *)0x0;
        }
        nextKey(this);
        TVar3 = (this->token_).type_;
      }
      if (TVar3 - END_OF_FILE < 2) {
        nextKey(this);
        return (Value *)(_Base_ptr)root;
      }
    }
  }
  return (Value *)0x0;
}

Assistant:

inline bool Parser::consumeForKey(TokenType type)
{
    if (token().type() == type) {
        nextKey();
        return true;
    }

    return false;
}